

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

void __thiscall toml::internal::Parser::nextKey(Parser *this)

{
  undefined1 local_50 [64];
  
  Lexer::nextKeyToken((Token *)local_50,&this->lexer_);
  Token::operator=(&this->token_,(Token *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 8));
  return;
}

Assistant:

void nextKey() { token_ = lexer_.nextKeyToken(); }